

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# runner.c
# Opt level: O0

RunnerContext * SetNodeValue(Runner *runner,ASTNode *node)

{
  ASTNode *pAVar1;
  int iVar2;
  void *__ptr;
  RunnerContext *left;
  RunnerContext *newContext;
  ASTNode *previousNode;
  int type;
  RunnerContext *context;
  char **strs;
  int frames;
  int i;
  void *callstack [128];
  ASTNode *node_local;
  Runner *runner_local;
  
  if (node == (ASTNode *)0x0) {
    printf("Invalid Check: %s in %s:%d\n","node != NULL","SetNodeValue",0xaa);
    iVar2 = backtrace(&frames,0x80);
    __ptr = (void *)backtrace_symbols(&frames,iVar2);
    for (strs._4_4_ = 0; strs._4_4_ < iVar2; strs._4_4_ = strs._4_4_ + 1) {
      printf("%s\n",*(undefined8 *)((long)__ptr + (long)strs._4_4_ * 8));
    }
    free(__ptr);
  }
  runner_local = (Runner *)GetContextByNodeId(runner,node->id);
  if (runner_local == (Runner *)0x0) {
    runner_local = (Runner *)GetNextContext(runner);
    runner_local->scope = (Scope *)node;
    switch(node->type) {
    case BOOLEAN:
      *(Token *)&runner_local->currentNode = node->type;
      ((anon_union_8_9_f6e6a019_for_value *)&runner_local->contexts)->vByte =
           (node->meta).booleanExpr.value & 1;
      break;
    case BYTE:
      *(Token *)&runner_local->currentNode = BYTE;
      ((anon_union_8_9_f6e6a019_for_value *)&runner_local->contexts)->vBoolean =
           (node->meta).booleanExpr.value;
      break;
    case SHORT:
      *(Token *)&runner_local->currentNode = SHORT;
      ((anon_union_8_9_f6e6a019_for_value *)&runner_local->contexts)->vShort =
           (node->meta).shortExpr.value;
      break;
    case INT:
      *(Token *)&runner_local->currentNode = INT;
      ((anon_union_8_9_f6e6a019_for_value *)&runner_local->contexts)->vInt =
           (node->meta).intExpr.value;
      break;
    case FLOAT:
      *(Token *)&runner_local->currentNode = FLOAT;
      ((anon_union_8_9_f6e6a019_for_value *)&runner_local->contexts)->vInt =
           (node->meta).intExpr.value;
      break;
    case DOUBLE:
      *(Token *)&runner_local->currentNode = DOUBLE;
      *(double *)&runner_local->contexts = (node->meta).doubleExpr.value;
      break;
    case LONG:
      *(Token *)&runner_local->currentNode = LONG;
      *(double *)&runner_local->contexts = (node->meta).doubleExpr.value;
      break;
    case CHAR:
      *(Token *)&runner_local->currentNode = CHAR;
      ((anon_union_8_9_f6e6a019_for_value *)&runner_local->contexts)->vBoolean =
           (node->meta).booleanExpr.value;
      break;
    case STRING:
      *(Token *)&runner_local->currentNode = STRING;
      *(double *)&runner_local->contexts = (node->meta).doubleExpr.value;
      break;
    case VAR:
      RunSetVarType(runner,(RunnerContext *)runner_local,node);
      break;
    case FUNC_CALL:
      pAVar1 = runner->currentNode;
      runner->currentNode = node;
      left = RunFuncCall(runner);
      runner->currentNode = pAVar1;
      MergeContextValues(left,(RunnerContext *)runner_local);
      GCContext(runner,left);
    }
  }
  return (RunnerContext *)runner_local;
}

Assistant:

RunnerContext* SetNodeValue(Runner* runner, ASTNode* node){
  CHECK(node != NULL);
  RunnerContext* context = GetContextByNodeId(runner, node->id);
  if (context != NULL){
    return context;
  }

  context = GetNextContext(runner);
  context->node = node;

  int type = (int) node->type;
  switch (type) {
    case BOOLEAN: {
      context->dataType = node->type;
      context->value.vBoolean = GET_BOOLEAN_VALUE(node);
      DEBUG_RUNNER("Runner: Set node value: %d\n", context->value.vBoolean);
      break;
    }
    case BYTE: {
      context->dataType = BYTE;
      context->value.vByte = GET_BYTE_VALUE(node);
      DEBUG_RUNNER("Runner: Set node value: %d\n", context->value.vByte);
      break;
    }
    case SHORT: {
      context->dataType = SHORT;
      context->value.vShort = GET_SHORT_VALUE(node);
      DEBUG_RUNNER("Runner: Set node value: %d\n", context->value.vShort);
      break;
    }
    case INT: {
      context->dataType = INT;
      context->value.vInt = GET_INT_VALUE(node);
      DEBUG_RUNNER("Runner: Set node value: %d\n", context->value.vInt);
      break;
    }
    case FLOAT: {
      context->dataType = FLOAT;
      context->value.vFloat = GET_FLOAT_VALUE(node);
      DEBUG_RUNNER("Runner: Set node value: %f\n", context->value.vFloat);
      break;
    }
    case DOUBLE: {
      context->dataType = DOUBLE;
      context->value.vDouble = GET_DOUBLE_VALUE(node);
      DEBUG_RUNNER("Runner: Set node value: %f\n", context->value.vDouble);
      break;
    }
    case LONG: {
      context->dataType = LONG;
      context->value.vLong = GET_LONG_VALUE(node);
      DEBUG_RUNNER("Runner: Set node value: %ld\n", context->value.vLong);
      break;
    }
    case CHAR: {
      context->dataType = CHAR;
      context->value.vChar = GET_CHAR_VALUE(node);
      DEBUG_RUNNER("Runner: Set node value: %c\n", context->value.vChar);
      break;
    }
    case STRING: {
      context->dataType = STRING;
      context->value.vString = GET_STRING_VALUE(node);
      DEBUG_RUNNER("Runner: Set node value: %s\n", context->value.vString);
      break;
    }
    case VAR: {
      RunSetVarType(runner, context, node);
      break;
    }
    case FUNC_CALL: {
      ASTNode* previousNode = runner->currentNode;
      runner->currentNode = node;
      RunnerContext* newContext = RunFuncCall(runner);
      runner->currentNode = previousNode;
      MergeContextValues(newContext, context);
      GCContext(runner, newContext);
      break;
    }
  }

  return context;
}